

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

void custom_format<int>(char *format_str,int *args)

{
  size_t sVar1;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  ulong local_248 [2];
  undefined **local_238;
  undefined1 *local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined1 local_218 [504];
  
  local_248[0] = (ulong)(uint)*args;
  sVar1 = strlen(format_str);
  local_228 = 0;
  local_238 = &PTR_grow_002a3c18;
  local_220 = 500;
  format_str_00.size_ = sVar1;
  format_str_00.data_ = format_str;
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_248;
  args_00.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_230 = local_218;
  fmt::v5::
  vformat_to<mock_arg_formatter,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_238,format_str_00,args_00,(locale_ref)0x0);
  local_238 = &PTR_grow_002a3c18;
  if (local_230 != local_218) {
    operator_delete(local_230);
  }
  return;
}

Assistant:

void custom_format(const char *format_str, const Args & ... args) {
  auto va = fmt::make_format_args(args...);
  return custom_vformat(format_str, va);
}